

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioply.c
# Opt level: O3

int trico_write_ply(uint32_t nr_of_vertices,float *vertices,float *vertex_normals,
                   uint32_t *vertex_colors,uint32_t nr_of_triangles,uint32_t *triangles,
                   float *texcoords,char *filename)

{
  FILE *__s;
  ulong uVar1;
  int iVar2;
  uint32_t *__ptr;
  uint uVar3;
  
  iVar2 = 0;
  if (nr_of_vertices != 0 && vertices != (float *)0x0) {
    __s = fopen(filename,"wb");
    iVar2 = 0;
    if (__s != (FILE *)0x0) {
      fwrite("ply\n",4,1,__s);
      fwrite("format binary_little_endian 1.0\n",0x20,1,__s);
      fprintf(__s,"element vertex %d\n",(ulong)nr_of_vertices);
      fwrite("property float x\n",0x11,1,__s);
      fwrite("property float y\n",0x11,1,__s);
      fwrite("property float z\n",0x11,1,__s);
      if (vertex_normals != (float *)0x0) {
        fwrite("property float nx\n",0x12,1,__s);
        fwrite("property float ny\n",0x12,1,__s);
        fwrite("property float nz\n",0x12,1,__s);
      }
      if (vertex_colors != (uint32_t *)0x0) {
        fwrite("property uchar red\n",0x13,1,__s);
        fwrite("property uchar green\n",0x15,1,__s);
        fwrite("property uchar blue\n",0x14,1,__s);
        fwrite("property uchar alpha\n",0x15,1,__s);
      }
      if (triangles != (uint32_t *)0x0 && nr_of_triangles != 0) {
        fprintf(__s,"element face %d\n",(ulong)nr_of_triangles);
        fwrite("property list uchar int vertex_indices\n",0x27,1,__s);
        if (texcoords != (float *)0x0) {
          fwrite("property list uchar float texcoord\n",0x23,1,__s);
        }
      }
      fwrite("end_header\n",0xb,1,__s);
      uVar1 = (ulong)nr_of_vertices;
      uVar3 = 0;
      __ptr = vertex_colors;
      do {
        fwrite(vertices + uVar3,4,3,__s);
        if (vertex_normals != (float *)0x0) {
          fwrite(vertex_normals + uVar3,4,3,__s);
        }
        if (vertex_colors != (uint32_t *)0x0) {
          fwrite(__ptr,4,1,__s);
        }
        uVar3 = uVar3 + 3;
        __ptr = __ptr + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
      if (nr_of_triangles != 0) {
        uVar1 = 0;
        do {
          fputc(3,__s);
          fwrite(triangles + (uint)((int)uVar1 * 3),4,3,__s);
          if (texcoords != (float *)0x0) {
            fputc(6,__s);
            fwrite(texcoords + (uint)((int)uVar1 * 6),4,6,__s);
          }
          uVar1 = uVar1 + 1;
        } while (uVar1 != nr_of_triangles);
      }
      fclose(__s);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int trico_write_ply(const uint32_t nr_of_vertices, const float* vertices, const float* vertex_normals, const uint32_t* vertex_colors, const uint32_t nr_of_triangles, const uint32_t* triangles, const float* texcoords, const char* filename)
  {
  if (!vertices)
    return 0;
  if (nr_of_vertices == 0)
    return 0;

  FILE* fp = fopen(filename, "wb");

  if (!fp)
    return 0;

  fprintf(fp, "ply\n");
  int n = 1;
  if (*(char *)&n == 1)
    fprintf(fp, "format binary_little_endian 1.0\n");
  else
    fprintf(fp, "format binary_big_endian 1.0\n");

  fprintf(fp, "element vertex %d\n", nr_of_vertices);
  fprintf(fp, "property float x\n");
  fprintf(fp, "property float y\n");
  fprintf(fp, "property float z\n");

  if (vertex_normals)
    {
    fprintf(fp, "property float nx\n");
    fprintf(fp, "property float ny\n");
    fprintf(fp, "property float nz\n");
    }

  if (vertex_colors)
    {
    fprintf(fp, "property uchar red\n");
    fprintf(fp, "property uchar green\n");
    fprintf(fp, "property uchar blue\n");
    fprintf(fp, "property uchar alpha\n");
    }

  if (nr_of_triangles && triangles)
    {
    fprintf(fp, "element face %d\n", nr_of_triangles);
    fprintf(fp, "property list uchar int vertex_indices\n");
    if (texcoords)
      fprintf(fp, "property list uchar float texcoord\n");
    }
  fprintf(fp, "end_header\n");

  for (uint32_t i = 0; i < nr_of_vertices; ++i)
    {
    fwrite(vertices + 3 * i, sizeof(float), 3, fp);
    if (vertex_normals)
      fwrite(vertex_normals + 3 * i, sizeof(float), 3, fp);
    if (vertex_colors)
      fwrite(vertex_colors + i, sizeof(uint32_t), 1, fp);
    }
  const unsigned char tria_size = 3;
  const unsigned char texcoord_size = 6;
  for (uint32_t i = 0; i < nr_of_triangles; ++i)
    {
    fwrite(&tria_size, 1, 1, fp);
    fwrite(triangles + 3 * i, sizeof(uint32_t), 3, fp);
    if (texcoords)
      {
      fwrite(&texcoord_size, 1, 1, fp);
      fwrite(texcoords + 6 * i, sizeof(float), 6, fp);
      }
    }
  fclose(fp);
  return 1;
  }